

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O1

void __thiscall
Centaurus::DFA<unsigned_char>::filter_nodes
          (DFA<unsigned_char> *this,vector<bool,_std::allocator<bool>_> *mask)

{
  value_type *pvVar1;
  pointer pNVar2;
  pointer pDVar3;
  pointer pDVar4;
  ulong uVar5;
  ulong uVar6;
  NFATransition<unsigned_char> *t;
  value_type *__x;
  DFAState<unsigned_char> *n;
  NFATransition<unsigned_char> *t_1;
  pointer pNVar7;
  ulong uVar8;
  vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  nodes;
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  filtered;
  vector<int,_std::allocator<int>_> index_map;
  int local_9c;
  vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  local_98;
  vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  local_78;
  DFA<unsigned_char> *local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_98.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,
             ((long)(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                    super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                    super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,
             (allocator_type *)&local_78);
  if (((long)(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
             super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
             super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7 -
      ((ulong)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset +
      ((long)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) != 0) {
    __assert_fail("m_states.size() == mask.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/DFA.hpp"
                  ,0xe9,
                  "void Centaurus::DFA<unsigned char>::filter_nodes(const std::vector<bool> &) [TCHAR = unsigned char]"
                 );
  }
  pDVar4 = (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
           super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
       super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pDVar3 = local_98.
           super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pDVar4;
  if (local_78.
      super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pDVar4) {
    uVar8 = 0;
    local_9c = 0;
    local_58 = this;
    do {
      if (((mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar8] = -1;
      }
      else {
        local_78.
        super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.
        super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.
        super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_50 = uVar8 * 9;
        pvVar1 = pDVar4[uVar8].super_NFABaseState<unsigned_char,_Centaurus::IndexVector>.
                 m_transitions.
                 super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__x = pDVar4[uVar8].super_NFABaseState<unsigned_char,_Centaurus::IndexVector>.
                   m_transitions.
                   super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this = local_58, __x != pvVar1;
            __x = __x + 1) {
          uVar5 = (ulong)__x->m_dest;
          uVar6 = uVar5 + 0x3f;
          if (-1 < (long)uVar5) {
            uVar6 = uVar5;
          }
          if (((mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p
               [((long)uVar6 >> 6) +
                (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar5 & 0x3f) & 1) != 0) {
            std::
            vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
            ::push_back((vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                         *)&local_78,__x);
          }
        }
        pDVar4 = (local_58->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                 super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = ((long)(local_58->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                       super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar4 >> 3) *
                -0x71c71c71c71c71c7;
        if (uVar6 < uVar8 || uVar6 - uVar8 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar8);
        }
        std::
        vector<Centaurus::DFAState<unsigned_char>,std::allocator<Centaurus::DFAState<unsigned_char>>>
        ::
        emplace_back<Centaurus::DFAState<unsigned_char>&,std::vector<Centaurus::NFATransition<unsigned_char>,std::allocator<Centaurus::NFATransition<unsigned_char>>>>
                  ((vector<Centaurus::DFAState<unsigned_char>,std::allocator<Centaurus::DFAState<unsigned_char>>>
                    *)&local_98,
                   (DFAState<unsigned_char> *)
                   (&(pDVar4->super_NFABaseState<unsigned_char,_Centaurus::IndexVector>).
                     _vptr_NFABaseState + local_50),
                   (vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                    *)&local_78);
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar8] = local_9c;
        local_9c = local_9c + 1;
        std::
        vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
        ::~vector((vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                   *)&local_78);
      }
      uVar8 = uVar8 + 1;
      pDVar4 = (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
               super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_78.
      super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
           super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      uVar6 = ((long)local_78.
                     super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar4 >> 3) *
              -0x71c71c71c71c71c7;
      pDVar3 = local_98.
               super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_78.
      super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pDVar4;
    } while (uVar8 <= uVar6 && uVar6 - uVar8 != 0);
  }
  for (; pDVar3 != local_98.
                   super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pDVar3 = pDVar3 + 1) {
    pNVar2 = (pDVar3->super_NFABaseState<unsigned_char,_Centaurus::IndexVector>).m_transitions.
             super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pNVar7 = (pDVar3->super_NFABaseState<unsigned_char,_Centaurus::IndexVector>).m_transitions.
                  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pNVar7 != pNVar2; pNVar7 = pNVar7 + 1)
    {
      pNVar7->m_dest =
           *(int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (long)pNVar7->m_dest * 4);
    }
  }
  local_78.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((NFABase<Centaurus::DFAState<unsigned_char>_> *)((long)this + 0x18))->_vptr_NFABase
  ;
  ((NFABase<Centaurus::DFAState<unsigned_char>_> *)((long)this + 8))->_vptr_NFABase =
       (_func_int **)
       local_98.
       super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ((NFABase<Centaurus::DFAState<unsigned_char>_> *)((long)this + 0x10))->_vptr_NFABase =
       (_func_int **)
       local_98.
       super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ((NFABase<Centaurus::DFAState<unsigned_char>_> *)((long)this + 0x18))->_vptr_NFABase =
       (_func_int **)
       local_98.
       super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>::
  ~vector(&local_78);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>::
  ~vector(&local_98);
  return;
}

Assistant:

void filter_nodes(const std::vector<bool>& mask)
    {
        std::vector<DFAState<TCHAR> > nodes;
        std::vector<int> index_map(m_states.size());

        assert(m_states.size() == mask.size());

        for (int src_index = 0, dest_index = 0; src_index < m_states.size(); src_index++)
        {
            if (mask[src_index])
            {
                std::vector<DFATransition<TCHAR> > filtered;
                for (const auto& t : m_states.at(src_index).get_transitions())
                {
                    if (mask[t.dest()])
                    {
                        filtered.push_back(t);
                    }
                }
                nodes.emplace_back(m_states.at(src_index), std::move(filtered));
                index_map[src_index] = dest_index;
                dest_index++;
            }
            else
            {
                index_map[src_index] = -1;
            }
        }

        for (auto& n : nodes)
        {
            for (auto& t : n.get_transitions())
            {
                t.dest(index_map[t.dest()]);
            }
        }
        m_states = std::move(nodes);
    }